

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpClientAdapter::DelayedEofInputStream::pumpTo
          (DelayedEofInputStream *this,AsyncOutputStream *output,uint64_t amount)

{
  PromiseArenaMember *node;
  PromiseArenaMember *in_RAX;
  Promise<unsigned_long> *in_RCX;
  PromiseArenaMember *local_28;
  
  local_28 = in_RAX;
  (**(code **)(*output[2]._vptr_AsyncOutputStream + 0x18))(&local_28);
  wrap<unsigned_long>(this,(unsigned_long)output,in_RCX);
  node = local_28;
  if (local_28 != (PromiseArenaMember *)0x0) {
    local_28 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<uint64_t> pumpTo(kj::AsyncOutputStream& output, uint64_t amount) override {
      return wrap(amount, inner->pumpTo(output, amount));
    }